

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSharedData::SetCircleTessellationMaxError(ImDrawListSharedData *this,float max_error)

{
  undefined1 auVar1 [16];
  int iVar2;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float radius;
  int i;
  undefined1 local_24;
  undefined4 local_10;
  
  if ((*(float *)(in_RDI + 0x18) != in_XMM0_Da) ||
     (NAN(*(float *)(in_RDI + 0x18)) || NAN(in_XMM0_Da))) {
    *(float *)(in_RDI + 0x18) = in_XMM0_Da;
    for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
      if (local_10 < 1) {
        local_24 = 0;
      }
      else {
        fVar3 = ImMin<float>(*(float *)(in_RDI + 0x18),(float)local_10);
        fVar3 = acosf(1.0 - fVar3 / (float)local_10);
        auVar1 = vroundss_avx(SUB6416(ZEXT464(0x40490fdb),0),ZEXT416((uint)(3.1415927 / fVar3)),10);
        iVar2 = ImClamp<int>(((int)auVar1._0_4_ + 1) / 2 << 1,4,0x200);
        local_24 = (undefined1)iVar2;
      }
      *(undefined1 *)(in_RDI + 0x90 + (long)local_10) = local_24;
    }
  }
  return;
}

Assistant:

void ImDrawListSharedData::SetCircleTessellationMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = (float)i;
        CircleSegmentCounts[i] = (ImU8)((i > 0) ? IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError) : 0);
    }
}